

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

void __thiscall libtorrent::aux::peer_list::inc_failcount(peer_list *this,torrent_peer *p)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  
  uVar1 = *(uint *)&p->field_0x1b;
  if ((~uVar1 & 0x1f) != 0) {
    bVar2 = is_connect_candidate(this,p);
    *(uint *)&p->field_0x1b = uVar1 & 0xffffffe0 | uVar1 + 1 & 0x1f;
    if (bVar2) {
      bVar2 = is_connect_candidate(this,p);
      if (!bVar2) {
        iVar3 = 1;
        if (1 < this->m_num_connect_candidates) {
          iVar3 = this->m_num_connect_candidates;
        }
        this->m_num_connect_candidates = iVar3 + -1;
      }
    }
  }
  return;
}

Assistant:

void peer_list::inc_failcount(torrent_peer* p)
	{
		INVARIANT_CHECK;
		// failcount is a 5 bit value
		if (p->failcount == 31) return;

		bool const was_conn_cand = is_connect_candidate(*p);
		++p->failcount;
		if (was_conn_cand && !is_connect_candidate(*p))
			update_connect_candidates(-1);
	}